

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> * __thiscall
embree::XMLLoader::loadVec3fArray
          (vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
           *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  bool bVar2;
  ulong uVar3;
  runtime_error *this_01;
  long lVar4;
  size_t i;
  long lVar5;
  float fVar6;
  allocator local_79;
  float local_78;
  float local_74;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"ofs",&local_79);
    XML::parm(&local_50,this_00,&local_70);
    bVar2 = std::operator!=(&local_50,"");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                (__return_storage_ptr__,this,xml);
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar3 = ((long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x48;
      if (uVar3 % 3 != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&xml->ptr->loc);
        std::operator+(&local_50,&local_70,": wrong vector<float3> body");
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::resize
                (__return_storage_ptr__,uVar3 / 3);
      lVar5 = 8;
      lVar4 = 0x90;
      for (uVar3 = 0;
          uVar3 < (ulong)(((long)(__return_storage_ptr__->
                                 super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar3 = uVar3 + 1) {
        local_74 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                         lVar4),true);
        local_78 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                         lVar4),true);
        fVar6 = Token::Float((Token *)((long)&((xml->ptr->body).
                                               super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ty +
                                      lVar4),true);
        pVVar1 = (__return_storage_ptr__->
                 super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)pVVar1 + lVar5 + -8) = local_74;
        *(float *)((long)pVVar1 + lVar5 + -4) = local_78;
        *(float *)((long)&pVVar1->field_0 + lVar5) = fVar6;
        lVar5 = lVar5 + 0xc;
        lVar4 = lVar4 + 0xd8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec3f> XMLLoader::loadVec3fArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3f>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3f>>(xml);
    } 
    else 
    {
      std::vector<Vec3f> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3f(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }